

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O2

shared_ptr<MyCompiler::Block> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Block>(RecursiveDescentParser *this)

{
  istream *piVar1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<MyCompiler::Block> sVar3;
  __shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::make_shared<MyCompiler::Block>();
  iVar2 = *(int *)(in_RSI + 0x30);
  if (iVar2 == 0x1c) {
    parse<MyCompiler::ConstDeclaration>((RecursiveDescentParser *)&local_38);
    std::__shared_ptr<MyCompiler::ConstDeclaration,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<MyCompiler::ConstDeclaration,_(__gnu_cxx::_Lock_policy)2> *)
               (this->stream + 0x48),
               (__shared_ptr<MyCompiler::ConstDeclaration,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    iVar2 = *(int *)(in_RSI + 0x30);
  }
  if (iVar2 == 0x1d) {
    parse<MyCompiler::VarDeclaration>((RecursiveDescentParser *)&local_38);
    std::__shared_ptr<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2> *)
               (this->stream + 0x58),
               (__shared_ptr<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  while (*(int *)(in_RSI + 0x30) == 0x1e) {
    piVar1 = this->stream;
    parse<MyCompiler::ProcedureDeclaration>((RecursiveDescentParser *)&local_38);
    std::vector<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>
    ::push_back((vector<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>
                 *)(piVar1 + 0x68),(value_type *)local_38._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  parse<MyCompiler::Statement>((RecursiveDescentParser *)&local_38);
  std::__shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2> *)
             (this->stream + 0x80),&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  sVar3.super___shared_ptr<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Block>)
         sVar3.super___shared_ptr<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Block> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Block>();

    if (sym == SymbolType::CONST)
        pResult->pConstDeclaration = parse<ConstDeclaration>();
    if (sym == SymbolType::VAR)
        pResult->pVarDeclaration = parse<VarDeclaration>();
    while (sym == SymbolType::PROC)
        pResult->vProcedureDeclaration.push_back(*parse<ProcedureDeclaration>());
    pResult->pStatement = parse<Statement>();

    return pResult;
}